

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O1

BUFFER_HANDLE constructDeviceOrModuleJson(IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo)

{
  _Bool _Var1;
  IOTHUB_REGISTRYMANAGER_AUTH_METHOD IVar2;
  bool bVar3;
  JSON_Status JVar4;
  undefined8 in_RAX;
  LOGGER_LOG p_Var5;
  JSON_Value *value;
  JSON_Object *object;
  uchar *source;
  size_t size;
  BUFFER_HANDLE handle;
  int iVar6;
  char *pcVar7;
  undefined4 uVar8;
  
  uVar8 = (undefined4)((ulong)in_RAX >> 0x20);
  _Var1 = deviceOrModuleInfo->iotEdge_capable;
  if ((deviceOrModuleInfo->deviceId == (char *)0x0) &&
     (p_Var5 = xlogging_get_log_function(), p_Var5 != (LOGGER_LOG)0x0)) {
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
              ,"constructDeviceOrModuleJson",0x1c3,1,"Device id cannot be NULL");
  }
  value = json_value_init_object();
  if (value == (JSON_Value *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
LAB_001382d1:
      object = (JSON_Object *)0x0;
      goto LAB_001382d4;
    }
    pcVar7 = "json_value_init_object failed";
    iVar6 = 0x1c8;
LAB_001382c4:
    object = (JSON_Object *)0x0;
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
              ,"constructDeviceOrModuleJson",iVar6,1,pcVar7);
    goto LAB_001382d4;
  }
  object = json_value_get_object(value);
  if (object == (JSON_Object *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001382d1;
    pcVar7 = "json_value_get_object failed";
    iVar6 = 0x1cd;
    goto LAB_001382c4;
  }
  JVar4 = json_object_set_string(object,"deviceId",deviceOrModuleInfo->deviceId);
  if (JVar4 != 0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001382d4;
    pcVar7 = "json_object_set_string failed for deviceId";
    iVar6 = 0x1d2;
    goto LAB_0013825d;
  }
  if ((deviceOrModuleInfo->moduleId != (char *)0x0) &&
     (JVar4 = json_object_set_string(object,"moduleId",deviceOrModuleInfo->moduleId), JVar4 != 0)) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar7 = "json_object_set_string failed for moduleId";
      iVar6 = 0x1d7;
      goto LAB_0013825d;
    }
    goto LAB_001382d4;
  }
  if ((deviceOrModuleInfo->managedBy != (char *)0x0) &&
     (JVar4 = json_object_set_string(object,"managedBy",deviceOrModuleInfo->managedBy), JVar4 != 0))
  {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar7 = "json_object_set_string failed for managedBy";
      iVar6 = 0x1dc;
      goto LAB_0013825d;
    }
    goto LAB_001382d4;
  }
  pcVar7 = "enabled";
  if (deviceOrModuleInfo->status == IOTHUB_DEVICE_STATUS_DISABLED) {
    pcVar7 = "disabled";
  }
  JVar4 = json_object_dotset_string(object,"status",pcVar7);
  if (JVar4 != 0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar7 = "json_object_dotset_string failed for status";
      iVar6 = 0x1e1;
      goto LAB_0013825d;
    }
    goto LAB_001382d4;
  }
  IVar2 = deviceOrModuleInfo->authMethod;
  switch(IVar2) {
  case IOTHUB_REGISTRYMANAGER_AUTH_SPK:
    pcVar7 = "sas";
    break;
  case IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT:
    pcVar7 = "selfSigned";
    break;
  case IOTHUB_REGISTRYMANAGER_AUTH_X509_CERTIFICATE_AUTHORITY:
    pcVar7 = "certificateAuthority";
    break;
  case IOTHUB_REGISTRYMANAGER_AUTH_NONE:
    pcVar7 = "none";
    break;
  default:
    p_Var5 = xlogging_get_log_function();
    bVar3 = true;
    if (p_Var5 == (LOGGER_LOG)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = (char *)0x0;
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"getAuthTypeStringForJson",0x1a9,1,"Cannot map <%d> to auth type for JSON string",
                CONCAT44(uVar8,IVar2));
    }
    goto LAB_0013848e;
  }
  bVar3 = false;
LAB_0013848e:
  if ((bVar3) ||
     (JVar4 = json_object_dotset_string(object,"authentication.type",pcVar7), JVar4 != 0)) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar7 = "json_object_dotset_string failed for authType";
      iVar6 = 0x1e6;
LAB_0013825d:
      handle = (BUFFER_HANDLE)0x0;
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"constructDeviceOrModuleJson",iVar6,1,pcVar7);
      goto LAB_001382d7;
    }
  }
  else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_SPK) &&
          (JVar4 = json_object_dotset_string
                             (object,"authentication.symmetricKey.primaryKey",
                              deviceOrModuleInfo->primaryKey), JVar4 != 0)) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar7 = "json_object_dotset_string failed for primarykey";
      iVar6 = 0x1ee;
      goto LAB_0013825d;
    }
  }
  else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_SPK) &&
          (JVar4 = json_object_dotset_string
                             (object,"authentication.symmetricKey.secondaryKey",
                              deviceOrModuleInfo->secondaryKey), JVar4 != 0)) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar7 = "json_object_dotset_string failed for secondaryKey";
      iVar6 = 499;
      goto LAB_0013825d;
    }
  }
  else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT) &&
          (JVar4 = json_object_dotset_string
                             (object,"authentication.x509Thumbprint.primaryThumbprint",
                              deviceOrModuleInfo->primaryKey), JVar4 != 0)) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar7 = "json_object_dotset_string failed for primaryThumbprint";
      iVar6 = 0x1f8;
      goto LAB_0013825d;
    }
  }
  else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT) &&
          (JVar4 = json_object_dotset_string
                             (object,"authentication.x509Thumbprint.secondaryThumbprint",
                              deviceOrModuleInfo->secondaryKey), JVar4 != 0)) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar7 = "json_object_dotset_string failed for secondaryThumbprint";
      iVar6 = 0x1fd;
      goto LAB_0013825d;
    }
  }
  else if ((deviceOrModuleInfo->moduleId == (char *)0x0) &&
          (JVar4 = json_object_dotset_boolean(object,"capabilities.iotEdge",(uint)_Var1), JVar4 != 0
          )) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar7 = "json_object_dotset_string failed for iotEdge capable";
      iVar6 = 0x202;
      goto LAB_0013825d;
    }
  }
  else {
    source = (uchar *)json_serialize_to_string(value);
    if (source != (uchar *)0x0) {
      size = strlen((char *)source);
      handle = BUFFER_create(source,size);
      if (handle == (BUFFER_HANDLE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) {
          handle = (BUFFER_HANDLE)0x0;
        }
        else {
          handle = (BUFFER_HANDLE)0x0;
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"constructDeviceOrModuleJson",0x211,1,"Buffer_Create failed");
        }
      }
      json_free_serialized_string(source);
      goto LAB_001382d7;
    }
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar7 = "json_serialize_to_string failed";
      iVar6 = 0x20a;
      goto LAB_0013825d;
    }
  }
LAB_001382d4:
  handle = (BUFFER_HANDLE)0x0;
LAB_001382d7:
  JVar4 = json_object_clear(object);
  if (JVar4 != 0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"constructDeviceOrModuleJson",0x21a,1,"json_object_clear failed");
    }
    BUFFER_delete(handle);
    handle = (BUFFER_HANDLE)0x0;
  }
  if (value != (JSON_Value *)0x0) {
    json_value_free(value);
  }
  return handle;
}

Assistant:

static BUFFER_HANDLE constructDeviceOrModuleJson(const IOTHUB_DEVICE_OR_MODULE* deviceOrModuleInfo)
{
    BUFFER_HANDLE result;

    JSON_Value* root_value = NULL;
    JSON_Object* root_object = NULL;
    JSON_Status jsonStatus;

    const char *authTypeForJson;

    int iotEdge_capable = (deviceOrModuleInfo->iotEdge_capable == true) ? 1 : 0;

    if (deviceOrModuleInfo == NULL)
    {
        LogError("deviceOrModuleInfo cannot be null");
        result = NULL;
    }
    else if (deviceOrModuleInfo->deviceId == NULL)
    {
        LogError("Device id cannot be NULL");
        result = NULL;
    }
    if ((root_value = json_value_init_object()) == NULL)
    {
        LogError("json_value_init_object failed");
        result = NULL;
    }
    else if ((root_object = json_value_get_object(root_value)) == NULL)
    {
        LogError("json_value_get_object failed");
        result = NULL;
    }
    else if ((json_object_set_string(root_object, DEVICE_JSON_KEY_DEVICE_NAME, deviceOrModuleInfo->deviceId)) != JSONSuccess)
    {
        LogError("json_object_set_string failed for deviceId");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->moduleId != NULL) && ((json_object_set_string(root_object, DEVICE_JSON_KEY_MODULE_NAME, deviceOrModuleInfo->moduleId)) != JSONSuccess))
    {
        LogError("json_object_set_string failed for moduleId");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->managedBy != NULL) && ((json_object_set_string(root_object, DEVICE_JSON_KEY_MANAGED_BY, deviceOrModuleInfo->managedBy)) != JSONSuccess))
    {
        LogError("json_object_set_string failed for managedBy");
        result = NULL;
    }
    else if (json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_STATUS, getStatusStringForJson(deviceOrModuleInfo->status)) != JSONSuccess)
    {
        LogError("json_object_dotset_string failed for status");
        result = NULL;
    }
    else if ((NULL == (authTypeForJson = getAuthTypeStringForJson(deviceOrModuleInfo->authMethod))) || ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_AUTH_TYPE, authTypeForJson)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for authType");
        result = NULL;
    }
    //
    // Static function here.  We make the assumption that the auth method has been validated by the caller of this function.
    //
    else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_SPK) && ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_PRIMARY_KEY, deviceOrModuleInfo->primaryKey)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for primarykey");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_SPK) && ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_SECONDARY_KEY, deviceOrModuleInfo->secondaryKey)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for secondaryKey");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT) && ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_PRIMARY_THUMBPRINT, deviceOrModuleInfo->primaryKey)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for primaryThumbprint");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT) && ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_SECONDARY_THUMBPRINT, deviceOrModuleInfo->secondaryKey)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for secondaryThumbprint");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->moduleId == NULL) && (json_object_dotset_boolean(root_object, DEVICE_JSON_KEY_CAPABILITIES_IOTEDGE, iotEdge_capable)) != JSONSuccess)
    {
        LogError("json_object_dotset_string failed for iotEdge capable");
        result = NULL;
    }
    else
    {
        char* serialized_string;
        if ((serialized_string = json_serialize_to_string(root_value)) == NULL)
        {
            LogError("json_serialize_to_string failed");
            result = NULL;
        }
        else
        {
            if ((result = BUFFER_create((const unsigned char*)serialized_string, strlen(serialized_string))) == NULL)
            {
                LogError("Buffer_Create failed");
                result = NULL;
            }
            json_free_serialized_string(serialized_string);
        }
    }

    if ((jsonStatus = json_object_clear(root_object)) != JSONSuccess)
    {
        LogError("json_object_clear failed");
        BUFFER_delete(result);
        result = NULL;
    }
    if(root_value != NULL)
        json_value_free(root_value);

    return result;
}